

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  vVar2 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::
          fastAccessDx(&this->right_->fadexpr_,i);
  return vVar1 - vVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}